

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O0

_Bool duckdb_je_tsd_global_slow(void)

{
  uint32_t result;
  
  return tsd_global_slow_count.repr != 0;
}

Assistant:

bool
tsd_global_slow(void) {
	return atomic_load_u32(&tsd_global_slow_count, ATOMIC_RELAXED) > 0;
}